

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerFlight::EndEffect(APowerFlight *this)

{
  byte *pbVar1;
  double dVar2;
  AActor *pAVar3;
  TObjPtr<AActor> *obj;
  
  APowerup::EndEffect(&this->super_APowerup);
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar3 != (AActor *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar3->player != (player_t *)0x0) {
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (((pAVar3->flags7).Value & 0x20000) == 0) {
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
        dVar2 = (pAVar3->__Pos).Z;
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
        if ((dVar2 != pAVar3->floorz) || (NAN(dVar2) || NAN(pAVar3->floorz))) {
          pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
          pAVar3->player->centering = true;
        }
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
        *(byte *)&(pAVar3->flags2).Value = (byte)(pAVar3->flags2).Value & 0xef;
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
        pbVar1 = (byte *)((long)&(pAVar3->flags).Value + 1);
        *pbVar1 = *pbVar1 & 0xfd;
      }
    }
  }
  return;
}

Assistant:

void APowerFlight::EndEffect ()
{
	Super::EndEffect();
	if (Owner == NULL || Owner->player == NULL)
	{
		return;
	}

	if (!(Owner->flags7 & MF7_FLYCHEAT))
	{
		if (Owner->Z() != Owner->floorz)
		{
			Owner->player->centering = true;
		}
		Owner->flags2 &= ~MF2_FLY;
		Owner->flags &= ~MF_NOGRAVITY;
	}
//	BorderTopRefresh = screen->GetPageCount (); //make sure the sprite's cleared out
}